

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void t1_make_subfont(FT_Face face,PS_Private priv,CFF_SubFont subfont)

{
  byte bVar1;
  FT_UInt32 FVar2;
  FT_Face_Internal pFVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CFF_SubFont local_30;
  FT_Face local_28;
  undefined1 local_1c [4];
  
  local_30 = subfont;
  local_28 = face;
  memset(subfont,0,0x4c8);
  bVar1 = priv->num_blue_values;
  (subfont->private_dict).num_blue_values = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).blue_values[uVar4] = (long)priv->blue_values[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  bVar1 = priv->num_other_blues;
  (subfont->private_dict).num_other_blues = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).other_blues[uVar4] = (long)priv->other_blues[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  bVar1 = priv->num_family_blues;
  (subfont->private_dict).num_family_blues = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).family_blues[uVar4] = (long)priv->family_blues[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  bVar1 = priv->num_family_other_blues;
  (subfont->private_dict).num_family_other_blues = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).family_other_blues[uVar4] = (long)priv->family_other_blues[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  (subfont->private_dict).blue_scale = priv->blue_scale;
  (subfont->private_dict).blue_shift = (long)priv->blue_shift;
  (subfont->private_dict).blue_fuzz = (long)priv->blue_fuzz;
  (subfont->private_dict).standard_width = (ulong)priv->standard_width[0];
  (subfont->private_dict).standard_height = (ulong)priv->standard_height[0];
  bVar1 = priv->num_snap_widths;
  (subfont->private_dict).num_snap_widths = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).snap_widths[uVar4] = (long)priv->snap_widths[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  bVar1 = priv->num_snap_heights;
  (subfont->private_dict).num_snap_heights = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      (subfont->private_dict).snap_heights[uVar4] = (long)priv->snap_heights[uVar4];
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
  }
  (subfont->private_dict).force_bold = priv->force_bold;
  (subfont->private_dict).lenIV = priv->lenIV;
  (subfont->private_dict).language_group = (FT_Int)priv->language_group;
  (subfont->private_dict).expansion_factor = priv->expansion_factor;
  (subfont->private_dict).subfont = subfont;
  pFVar3 = face->internal;
  FVar2 = pFVar3->random_seed;
  if ((FVar2 != 0xffffffff) && (subfont->random = FVar2, FVar2 != 0)) {
    uVar5 = pFVar3->random_seed;
    do {
      uVar5 = uVar5 << 0xd ^ uVar5;
      uVar5 = uVar5 >> 0x11 ^ uVar5;
      uVar5 = uVar5 << 5 ^ uVar5;
    } while ((int)uVar5 < 0);
    pFVar3->random_seed = uVar5;
  }
  if (subfont->random == 0) {
    uVar6 = (uint)local_1c ^ (uint)&local_30 ^ (uint)&local_28;
    uVar7 = uVar6 >> 0x14 ^ uVar6 >> 10;
    uVar5 = 0x7384;
    if (uVar7 != uVar6) {
      uVar5 = uVar7 ^ uVar6;
    }
    subfont->random = uVar5;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_make_subfont( FT_Face      face,
                   PS_Private   priv,
                   CFF_SubFont  subfont )
  {
    CFF_Private  cpriv = &subfont->private_dict;
    FT_UInt      n, count;


    FT_ZERO( subfont );
    FT_ZERO( cpriv );

    count = cpriv->num_blue_values = priv->num_blue_values;
    for ( n = 0; n < count; n++ )
      cpriv->blue_values[n] = (FT_Pos)priv->blue_values[n];

    count = cpriv->num_other_blues = priv->num_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->other_blues[n] = (FT_Pos)priv->other_blues[n];

    count = cpriv->num_family_blues = priv->num_family_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_blues[n] = (FT_Pos)priv->family_blues[n];

    count = cpriv->num_family_other_blues = priv->num_family_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_other_blues[n] = (FT_Pos)priv->family_other_blues[n];

    cpriv->blue_scale = priv->blue_scale;
    cpriv->blue_shift = (FT_Pos)priv->blue_shift;
    cpriv->blue_fuzz  = (FT_Pos)priv->blue_fuzz;

    cpriv->standard_width  = (FT_Pos)priv->standard_width[0];
    cpriv->standard_height = (FT_Pos)priv->standard_height[0];

    count = cpriv->num_snap_widths = priv->num_snap_widths;
    for ( n = 0; n < count; n++ )
      cpriv->snap_widths[n] = (FT_Pos)priv->snap_widths[n];

    count = cpriv->num_snap_heights = priv->num_snap_heights;
    for ( n = 0; n < count; n++ )
      cpriv->snap_heights[n] = (FT_Pos)priv->snap_heights[n];

    cpriv->force_bold       = priv->force_bold;
    cpriv->lenIV            = priv->lenIV;
    cpriv->language_group   = priv->language_group;
    cpriv->expansion_factor = priv->expansion_factor;

    cpriv->subfont = subfont;


    /* Initialize the random number generator. */
    if ( face->internal->random_seed != -1 )
    {
      /* If we have a face-specific seed, use it.    */
      /* If non-zero, update it to a positive value. */
      subfont->random = (FT_UInt32)face->internal->random_seed;
      if ( face->internal->random_seed )
      {
        do
        {
          face->internal->random_seed = (FT_Int32)cff_random(
            (FT_UInt32)face->internal->random_seed );

        } while ( face->internal->random_seed < 0 );
      }
    }
    if ( !subfont->random )
    {
      FT_UInt32  seed;


      /* compute random seed from some memory addresses */
      seed = (FT_UInt32)( (FT_Offset)(char*)&seed    ^
                          (FT_Offset)(char*)&face    ^
                          (FT_Offset)(char*)&subfont );
      seed = seed ^ ( seed >> 10 ) ^ ( seed >> 20 );
      if ( seed == 0 )
        seed = 0x7384;

      subfont->random = seed;
    }
  }